

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare.cpp
# Opt level: O1

int compare(string *directory1,string *basename1,string *directory2,string *basename2,
           Bounds *iBounds,Bounds *jBounds,Bounds *kBounds,Bounds *lBounds,double tolerance,
           bool infoOnly,
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *specificFields)

{
  string *psVar1;
  pointer pbVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  ulong uVar6;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var7;
  DataFieldInfo *pDVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  pointer pbVar12;
  char cVar13;
  bool bVar14;
  int iVar15;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fields;
  vector<bool,_std::allocator<bool>_> failed;
  IJKLBounds bounds;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fieldsAtSavepoint;
  DataFieldInfo info1;
  DataFieldInfo info2;
  Serializer serializer1;
  Serializer serializer2;
  uint local_424;
  vector<ser::Savepoint,_std::allocator<ser::Savepoint>_> local_420;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_408;
  vector<bool,_std::allocator<bool>_> local_3e8;
  ulong local_3c0;
  double local_3b8;
  undefined8 local_3b0;
  IJKLBounds local_3a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_388;
  Bounds *local_370;
  Bounds *local_368;
  string *local_360;
  DataFieldInfo local_358;
  DataFieldInfo local_2a8;
  Serializer local_200;
  Serializer local_118;
  
  local_200.globalMetainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_200.globalMetainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_200._vptr_Serializer = (_func_int **)&PTR__Serializer_00138b70;
  local_200.globalMetainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_200.globalMetainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_200.globalMetainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_200.fieldsTable_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_200.fieldsTable_.data_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_200.fieldsTable_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_200.fieldsTable_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_200.offsetTable_.savepointIndex_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_200.offsetTable_.savepointIndex_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_200.offsetTable_.savepointIndex_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  local_200.offsetTable_.savepointIndex_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_200.fieldsTable_.data_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_200.offsetTable_.savepoints_.
  super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_200.offsetTable_.savepoints_.
  super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_200.offsetTable_.savepoints_.
  super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_200.offsetTable_.entries_.
  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_200.offsetTable_.entries_.
  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_200.offsetTable_.entries_.
  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_200.offsetTable_.savepointIndex_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_200.pFileFormat_.px = (element_type *)0x0;
  local_200.pFileFormat_.pn.pi_ = (sp_counted_base *)0x0;
  local_3b8 = tolerance;
  local_370 = iBounds;
  local_368 = jBounds;
  local_200.globalMetainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_200.globalMetainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_200.fieldsTable_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_200.fieldsTable_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_200.offsetTable_.savepointIndex_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_200.offsetTable_.savepointIndex_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  ser::Serializer::Init(&local_200,directory1,basename1,SerializerOpenModeRead);
  local_118.globalMetainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_118.globalMetainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_118._vptr_Serializer = (_func_int **)&PTR__Serializer_00138b70;
  local_118.globalMetainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_118.globalMetainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_118.globalMetainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_118.fieldsTable_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_118.fieldsTable_.data_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_118.fieldsTable_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_118.fieldsTable_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_118.offsetTable_.savepointIndex_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_118.offsetTable_.savepointIndex_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_118.offsetTable_.savepointIndex_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  local_118.offsetTable_.savepointIndex_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_118.fieldsTable_.data_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_118.offsetTable_.savepoints_.
  super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.offsetTable_.savepoints_.
  super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.offsetTable_.savepoints_.
  super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118.offsetTable_.entries_.
  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.offsetTable_.entries_.
  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.offsetTable_.entries_.
  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118.offsetTable_.savepointIndex_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_118.pFileFormat_.px = (element_type *)0x0;
  local_118.pFileFormat_.pn.pi_ = (sp_counted_base *)0x0;
  local_118.globalMetainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_118.globalMetainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_118.fieldsTable_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_118.fieldsTable_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_118.offsetTable_.savepointIndex_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_118.offsetTable_.savepointIndex_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  ser::Serializer::Init(&local_118,directory2,basename2,SerializerOpenModeRead);
  std::vector<ser::Savepoint,_std::allocator<ser::Savepoint>_>::vector
            (&local_420,&local_200.offsetTable_.savepoints_);
  bVar14 = local_420.super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>._M_impl.
           super__Vector_impl_data._M_finish !=
           local_420.super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_420.super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_420.super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar9 = 0;
  }
  else {
    iVar15 = 0;
    uVar10 = 0;
    local_3b0 = 0;
    do {
      local_3c0 = uVar10;
      std::__cxx11::string::substr
                ((ulong)&local_358,
                 (ulong)(local_420.
                         super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>._M_impl
                         .super__Vector_impl_data._M_start + uVar10));
      iVar4 = std::__cxx11::string::compare((char *)&local_358);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358.name_._M_dataplus._M_p != &local_358.name_.field_2) {
        operator_delete(local_358.name_._M_dataplus._M_p);
      }
      if (iVar4 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"---------------------------------",0x21);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
        std::ostream::put(-0x80);
        std::ostream::flush();
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,
                            local_420.
                            super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar10].name_._M_dataplus._M_p,
                            local_420.
                            super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar10].name_._M_string_length)
        ;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        ser::MetainfoSet::ToString_abi_cxx11_
                  (&local_358.name_,
                   &local_420.super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar10].metainfo_);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_358.name_._M_dataplus._M_p,
                            local_358.name_._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358.name_._M_dataplus._M_p != &local_358.name_.field_2) {
          operator_delete(local_358.name_._M_dataplus._M_p);
        }
        ser::Serializer::FieldsAtSavepoint_abi_cxx11_
                  (&local_388,&local_200,
                   local_420.super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar10);
        local_408.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
        local_408.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
        local_408.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pbVar12 = (specificFields->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pbVar2 = (specificFields->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        if (pbVar12 == pbVar2) {
          ser::Serializer::FieldsAtSavepoint_abi_cxx11_
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_2a8,&local_200,
                     local_420.super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>.
                     _M_impl.super__Vector_impl_data._M_start + uVar10);
          local_358.name_.field_2._M_allocated_capacity =
               (size_type)
               local_408.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_358.name_._M_string_length =
               (size_type)
               local_408.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_358.name_._M_dataplus._M_p =
               (pointer)local_408.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          local_408.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)local_2a8.name_._M_dataplus._M_p;
          local_408.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_2a8.name_._M_string_length;
          local_408.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)local_2a8.name_.field_2._M_allocated_capacity;
          local_2a8.name_._M_dataplus._M_p = (pointer)0x0;
          local_2a8.name_._M_string_length = 0;
          local_2a8.name_.field_2._M_allocated_capacity = 0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_358);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_2a8);
        }
        else {
          uVar6 = (long)pbVar2 - (long)pbVar12 >> 5;
          uVar11 = (long)local_388.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_388.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5;
          if (uVar6 <= uVar11) {
            uVar11 = uVar6;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::resize(&local_408,uVar11);
          _Var7 = std::
                  __set_intersection<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                            (local_388.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             local_388.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                             (specificFields->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start,
                             (specificFields->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish,
                             local_408.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::resize(&local_408,
                   (long)_Var7._M_current -
                   (long)local_408.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5);
        }
        local_360 = local_408.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        pbVar12 = local_408.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (local_408.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_408.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          do {
            local_358.name_._M_dataplus._M_p._0_1_ = 9;
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(char *)&local_358,1);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,(pbVar12->_M_dataplus)._M_p,pbVar12->_M_string_length);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
            pDVar8 = ser::Serializer::FindField(&local_200,pbVar12);
            psVar1 = &local_358.type_;
            ser::DataFieldInfo::DataFieldInfo(&local_358,pDVar8);
            pDVar8 = ser::Serializer::FindField(&local_118,pbVar12);
            ser::DataFieldInfo::DataFieldInfo(&local_2a8,pDVar8);
            local_3a8.iLower = local_370->lower;
            if (local_370->lower < 1) {
              local_3a8.iLower = iVar15;
            }
            local_3a8.iUpper = local_358.iSize_ + -1;
            if (local_370->upper < local_358.iSize_ + -1) {
              local_3a8.iUpper = local_370->upper;
            }
            local_3a8.jLower = local_368->lower;
            if (local_368->lower < 1) {
              local_3a8.jLower = iVar15;
            }
            local_3a8.jUpper = local_358.jSize_ + -1;
            if (local_368->upper < local_358.jSize_ + -1) {
              local_3a8.jUpper = local_368->upper;
            }
            local_3a8.kLower = kBounds->lower;
            if (kBounds->lower < 1) {
              local_3a8.kLower = iVar15;
            }
            local_3a8.kUpper = local_358.kSize_ + -1;
            if (kBounds->upper < local_358.kSize_ + -1) {
              local_3a8.kUpper = kBounds->upper;
            }
            local_3a8.lLower = lBounds->lower;
            if (lBounds->lower < 1) {
              local_3a8.lLower = iVar15;
            }
            local_3a8.lUpper = local_358.lSize_ + -1;
            if (lBounds->upper < local_358.lSize_ + -1) {
              local_3a8.lUpper = lBounds->upper;
            }
            bVar3 = compareInfo(&local_358,&local_2a8);
            uVar9 = 1;
            if (bVar3) {
              uVar9 = local_424;
            }
            if (bVar3 && !infoOnly) {
              local_3e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
              local_3e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_offset = 0;
              local_3e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
              local_3e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_finish.super__Bit_iterator_base._M_offset = 0;
              local_3e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage = (_Bit_pointer)0x0;
              iVar4 = std::__cxx11::string::compare((char *)psVar1);
              if ((iVar4 == 0) ||
                 (iVar4 = std::__cxx11::string::compare((char *)psVar1), iVar4 == 0)) {
                bVar3 = compareData<int>(&local_200,&local_118,
                                         local_420.
                                         super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>
                                         ._M_impl.super__Vector_impl_data._M_start + uVar10,
                                         &local_358,&local_2a8,&local_3a8,local_3b8,&local_3e8);
                if (!bVar3) {
                  printDifference<int>
                            (&local_200,&local_118,
                             local_420.
                             super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>.
                             _M_impl.super__Vector_impl_data._M_start + uVar10,&local_358,&local_2a8
                             ,&local_3a8,&local_3e8);
                }
LAB_001165a9:
                local_3b0 = CONCAT71((int7)((ulong)local_3b0 >> 8),(byte)local_3b0 | bVar3 ^ 1U);
                cVar13 = '\0';
              }
              else {
                iVar4 = std::__cxx11::string::compare((char *)psVar1);
                if (iVar4 == 0) {
                  bVar3 = compareData<double>(&local_200,&local_118,
                                              local_420.
                                              super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>
                                              ._M_impl.super__Vector_impl_data._M_start + uVar10,
                                              &local_358,&local_2a8,&local_3a8,local_3b8,&local_3e8)
                  ;
                  if (!bVar3) {
                    printDifference<double>
                              (&local_200,&local_118,
                               local_420.
                               super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>.
                               _M_impl.super__Vector_impl_data._M_start + uVar10,&local_358,
                               &local_2a8,&local_3a8,&local_3e8);
                  }
                  goto LAB_001165a9;
                }
                iVar4 = std::__cxx11::string::compare((char *)psVar1);
                if (iVar4 == 0) {
                  bVar3 = compareData<float>(&local_200,&local_118,
                                             local_420.
                                             super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>
                                             ._M_impl.super__Vector_impl_data._M_start + uVar10,
                                             &local_358,&local_2a8,&local_3a8,local_3b8,&local_3e8);
                  if (!bVar3) {
                    printDifference<float>
                              (&local_200,&local_118,
                               local_420.
                               super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>.
                               _M_impl.super__Vector_impl_data._M_start + uVar10,&local_358,
                               &local_2a8,&local_3a8,&local_3e8);
                  }
                  goto LAB_001165a9;
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Unsupported type: ",0x12);
                poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cerr,local_358.type_._M_dataplus._M_p,
                                    local_358.type_._M_string_length);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
                std::ostream::put((char)poVar5);
                std::ostream::flush();
                local_424 = 2;
                cVar13 = '\x01';
              }
              if (local_3e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p !=
                  (_Bit_type *)0x0) {
                operator_delete(local_3e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
                local_3e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
                local_3e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
                local_3e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
                local_3e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
                local_3e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
              }
            }
            else {
              cVar13 = bVar3 * '\x05' + '\x01';
              local_424 = uVar9;
            }
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
                         *)&local_2a8.metainfo_);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a8.type_._M_dataplus._M_p != &local_2a8.type_.field_2) {
              operator_delete(local_2a8.type_._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a8.name_._M_dataplus._M_p != &local_2a8.name_.field_2) {
              operator_delete(local_2a8.name_._M_dataplus._M_p);
            }
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
                         *)&local_358.metainfo_);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_358.type_._M_dataplus._M_p != &local_358.type_.field_2) {
              operator_delete(local_358.type_._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_358.name_._M_dataplus._M_p != &local_358.name_.field_2) {
              operator_delete(local_358.name_._M_dataplus._M_p);
            }
            if ((cVar13 != '\x06') && (cVar13 != '\0')) goto LAB_001167af;
            pbVar12 = pbVar12 + 1;
          } while (pbVar12 != local_360);
        }
        cVar13 = '\x05';
LAB_001167af:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_408);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_388);
        if ((cVar13 != '\x05') && (cVar13 != '\0')) break;
      }
      uVar10 = local_3c0 + 1;
      uVar11 = ((long)local_420.super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_420.super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333;
      bVar3 = uVar11 - uVar10 != 0;
      bVar14 = uVar10 <= uVar11 && bVar3;
    } while (uVar10 <= uVar11 && bVar3);
    uVar9 = (uint)((byte)local_3b0 & 1);
    if (bVar14) {
      uVar9 = local_424;
    }
  }
  std::vector<ser::Savepoint,_std::allocator<ser::Savepoint>_>::~vector(&local_420);
  ser::Serializer::~Serializer(&local_118);
  ser::Serializer::~Serializer(&local_200);
  return uVar9;
}

Assistant:

int compare(const std::string& directory1, const std::string& basename1,
            const std::string& directory2, const std::string& basename2,
            const Bounds& iBounds, const Bounds& jBounds,
            const Bounds& kBounds, const Bounds& lBounds,
            double tolerance, bool infoOnly, const vector<string>& specificFields)

{
    Serializer serializer1;
    serializer1.Init(directory1, basename1, SerializerOpenModeRead);

    Serializer serializer2;
    serializer2.Init(directory2, basename2, SerializerOpenModeRead);

    vector<Savepoint> savepoints = serializer1.savepoints();

    bool hasDifferences = false;

    for (int i = 0; i < savepoints.size(); i++)
    {
        if (savepoints[i].name().substr(savepoints[i].name().size() - 4, 4) != "-out")
            continue;

        std::cout << "---------------------------------" << std::endl;
        std::cout << savepoints[i].name()                << std::endl;
        std::cout << savepoints[i].metainfo().ToString() << std::endl;

        vector<string> fieldsAtSavepoint = serializer1.FieldsAtSavepoint(savepoints[i]);
        vector<string> fields;

        if (specificFields.empty()) {

            fields = serializer1.FieldsAtSavepoint(savepoints[i]);
        } else {
            fields.resize(std::min(specificFields.size(), fieldsAtSavepoint.size()));
            auto it = std::set_intersection(fieldsAtSavepoint.begin(), fieldsAtSavepoint.end(),
                specificFields.begin(), specificFields.end(), fields.begin());
            fields.resize(it - fields.begin());
        }

        for (auto const& field : fields) {
            std::cout << '\t' << field << std::endl;

            DataFieldInfo info1 = serializer1.FindField(field);
            DataFieldInfo info2 = serializer2.FindField(field);

            IJKLBounds bounds = getIJKLBounds(info1, iBounds, jBounds, kBounds, lBounds);

            bool equal = compareInfo(info1, info2);
            if (!equal) {
                return 1;
            } else if (infoOnly) {
                continue;
            }

            vector<bool> failed;

            if (info1.type() == "integer" || info1.type() == "int") {
                equal = compareData<int>(serializer1, serializer2, savepoints[i], info1, info2, bounds, tolerance, failed);
                if (!equal) {
                    printDifference<int>(serializer1, serializer2, savepoints[i], info1, info2, bounds, failed);
                }
            } else if (info1.type() == "double") {
                equal = compareData<double>(serializer1, serializer2, savepoints[i], info1, info2, bounds, tolerance, failed);
                if (!equal) {
                    printDifference<double>(serializer1, serializer2, savepoints[i], info1, info2, bounds, failed);
                }
            } else if (info1.type() == "float") {
                equal = compareData<float>(serializer1, serializer2, savepoints[i], info1, info2, bounds, tolerance, failed);
                if (!equal) {
                    printDifference<float>(serializer1, serializer2, savepoints[i], info1, info2, bounds, failed);
                }
            } else {
                std::cerr << "Unsupported type: " << info1.type() << std::endl;
                return 2;
            }
            hasDifferences = hasDifferences | !equal;
        }
    }

    if (hasDifferences) {
        return 1;
    }
    return 0;
}